

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCatchExpr
          (ExprVisitorDelegate *this,TryExpr *expr)

{
  int iVar1;
  WatWriter *pWVar2;
  Info local_50;
  
  pWVar2 = this->writer_;
  iVar1 = pWVar2->indent_;
  pWVar2->indent_ = iVar1 + -2;
  if (1 < iVar1) {
    Opcode::GetInfo(&local_50,(Opcode *)&Opcode::Catch_Opcode);
    WritePuts(pWVar2,local_50.name,Space);
    pWVar2 = this->writer_;
    pWVar2->indent_ = pWVar2->indent_ + 2;
    (pWVar2->super_ModuleContext).label_stack_.
    super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.super__Vector_impl_data.
    _M_finish[-1].label_type = Catch;
    if (pWVar2->next_char_ == ForceNewline) {
      WriteNextChar(pWVar2);
    }
    pWVar2->next_char_ = ForceNewline;
    return (Result)Ok;
  }
  __assert_fail("indent_ >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wat-writer.cc"
                ,0xca,"void wabt::(anonymous namespace)::WatWriter::Dedent()");
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCatchExpr(TryExpr* expr) {
  writer_->Dedent();
  writer_->WritePutsSpace(Opcode::Catch_Opcode.GetName());
  writer_->Indent();
  writer_->SetTopLabelType(LabelType::Catch);
  writer_->WriteNewline(FORCE_NEWLINE);
  return Result::Ok;
}